

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_file_system.cpp
# Opt level: O2

bool __thiscall duckdb::CachingFileHandle::CanSeek(CachingFileHandle *this)

{
  bool bVar1;
  FileHandle *this_00;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> guard;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_> uStack_18;
  
  if (((this->file_handle).
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl == (FileHandle *)0x0) &&
     (this->validate != true)) {
    StorageLock::GetSharedLock((StorageLock *)&uStack_18);
    bVar1 = this->cached_file->can_seek;
    ::std::unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>::
    ~unique_ptr(&uStack_18);
    return bVar1;
  }
  this_00 = GetFileHandle(this);
  bVar1 = FileHandle::CanSeek(this_00);
  return bVar1;
}

Assistant:

bool CachingFileHandle::CanSeek() {
	if (file_handle || validate) {
		return GetFileHandle().CanSeek();
	}
	auto guard = cached_file.lock.GetSharedLock();
	return cached_file.CanSeek(guard);
}